

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void (anonymous_namespace)::check<Imf_3_2::TiledInputFile,Imf_3_2::TiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  undefined4 *puVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ostream *poVar8;
  ostream *__a;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  char *in_RDI;
  TiledInputFile file_2;
  MultiPartInputFile file_1;
  TiledOutputFile file;
  Header f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  allocator<char> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  __type local_1b9;
  allocator<char> local_119;
  string local_118 [32];
  TiledInputFile local_f8 [22];
  byte local_e2;
  allocator<char> local_e1;
  string local_e0 [32];
  MultiPartInputFile local_c0 [16];
  TiledOutputFile local_b0 [36];
  TileDescription local_8c;
  Channel local_7c [28];
  Vec2<float> local_60;
  TileDescription local_58 [3];
  byte local_19;
  string *local_18;
  string *local_10;
  char *local_8;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_2::Header::Header
            ((Header *)local_58,0x40,0x40,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar5 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_7c,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar5,(Channel *)"Dummy");
  bVar1 = std::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (bVar1) {
    Imf_3_2::Header::setType((string *)local_58);
  }
  puVar6 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar6 = 2;
  if ((local_19 & 1) != 0) {
    Imf_3_2::TileDescription::TileDescription(&local_8c,0x20,0x20,ONE_LEVEL,ROUND_DOWN);
    Imf_3_2::Header::setTileDescription(local_58);
  }
  remove(local_8);
  pcVar5 = local_8;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledOutputFile::TiledOutputFile(local_b0,pcVar5,(Header *)local_58,iVar4);
  Imf_3_2::TiledOutputFile::~TiledOutputFile(local_b0);
  pcVar5 = local_8;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_c0,pcVar5,iVar4,true);
  bVar1 = std::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (bVar1) {
    Imf_3_2::MultiPartInputFile::header((int)local_c0);
    Imf_3_2::Header::type_abi_cxx11_();
    bVar1 = std::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (bVar1) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error: expected type in header to be ");
      poVar8 = std::operator<<(poVar8,local_18);
      poVar8 = std::operator<<(poVar8," but got ");
      Imf_3_2::MultiPartInputFile::header((int)local_c0);
      psVar7 = (string *)Imf_3_2::Header::type_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,psVar7);
      poVar8 = std::operator<<(poVar8," from multipart when input type was ");
      _Var2 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_e2 = 0;
      if (_Var2) {
        std::allocator<char>::allocator();
        local_e2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      }
      else {
        std::__cxx11::string::string(local_e0,local_10);
      }
      poVar8 = std::operator<<(poVar8,local_e0);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_e0);
      if ((local_e2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_e1);
      }
    }
  }
  _Var2 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_1b9 = true;
  if (!_Var2) {
    Imf_3_2::MultiPartInputFile::header((int)local_c0);
    Imf_3_2::Header::type_abi_cxx11_();
    local_1b9 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  if (local_1b9 != false) {
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_c0);
    pcVar5 = local_8;
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile(local_f8,pcVar5,iVar4);
    _Var2 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (_Var2) {
      Imf_3_2::TiledInputFile::header();
      bVar3 = Imf_3_2::Header::hasType();
      if ((bVar3 & 1) != 0) {
        std::operator<<((ostream *)&std::cerr,
                        " type attribute got inserted when it shouldn\'t have been\n");
      }
      Imf_3_2::TiledInputFile::header();
      bVar3 = Imf_3_2::Header::hasType();
      if (((bVar3 ^ 0xff) & 1) == 0) {
        __assert_fail("!file.header ().hasType ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                      ,0x155,
                      "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::TiledInputFile, OUT = Imf_3_2::TiledOutputFile]"
                     );
      }
    }
    else {
      Imf_3_2::TiledInputFile::header();
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Imf_3_2::Header::type_abi_cxx11_();
      bVar1 = std::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (bVar1) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error: expected type in header to be ");
        __a = std::operator<<(poVar8,local_18);
        poVar9 = std::operator<<(__a," but got ");
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::TiledInputFile::header();
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
        poVar9 = std::operator<<(poVar9,(string *)__rhs);
        poVar9 = std::operator<<(poVar9," when input type was ");
        _Var2 = std::operator==(__lhs,__rhs);
        if (_Var2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,(char *)poVar8,(allocator<char> *)__a);
        }
        else {
          std::__cxx11::string::string(local_118,local_10);
        }
        poVar8 = std::operator<<(poVar9,local_118);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_118);
        if (_Var2) {
          std::allocator<char>::~allocator(&local_119);
        }
      }
    }
    Imf_3_2::TiledInputFile::~TiledInputFile(local_f8);
    remove(local_8);
    Imf_3_2::Header::~Header((Header *)local_58);
    return;
  }
  __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                ,0x148,
                "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::TiledInputFile, OUT = Imf_3_2::TiledOutputFile]"
               );
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}